

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O3

void make_ddrelocs(GlobalVars *gv,LinkedSection *ddrel)

{
  node *pnVar1;
  node **ppnVar2;
  LinkedSection *pLVar3;
  node *pnVar4;
  node *pnVar5;
  uint8_t *vp;
  uint8_t *puVar6;
  uint32_t x;
  node *pnVar7;
  node *pnVar8;
  
  pLVar3 = find_lnksec(gv,".sdata",'\0','\0','\0','\0');
  x = 0;
  if (pLVar3 != (LinkedSection *)0x0) {
    pnVar4 = (pLVar3->relocs).first;
    pnVar8 = pnVar4->next;
    x = 0;
    if (pnVar8 != (node *)0x0) {
      x = 0;
      do {
        if ((LinkedSection *)pnVar4[1].pred == pLVar3) {
          x = x + (*(char *)&pnVar4[3].pred == '\x01');
        }
        ppnVar2 = &pnVar8->next;
        pnVar4 = pnVar8;
        pnVar8 = *ppnVar2;
      } while (*ppnVar2 != (node *)0x0);
    }
  }
  pnVar8 = (node *)((ulong)(x + 1) << 2);
  pnVar4 = (node *)alloc((size_t)pnVar8);
  write32be(pnVar4,x);
  if (pLVar3 != (LinkedSection *)0x0) {
    pnVar7 = (pLVar3->relocs).first;
    pnVar1 = pnVar7->next;
    if (pnVar1 != (node *)0x0) {
      vp = (uint8_t *)((long)&pnVar4->next + 4);
      do {
        pnVar5 = pnVar1;
        puVar6 = vp;
        if (((LinkedSection *)pnVar7[1].pred == pLVar3) && (*(char *)&pnVar7[3].pred == '\x01')) {
          puVar6 = vp + 4;
          write32be(vp,*(uint32_t *)&pnVar7[2].next);
          pnVar5 = pnVar7->next;
        }
        pnVar1 = pnVar5->next;
        vp = puVar6;
        pnVar7 = pnVar5;
      } while (pnVar5->next != (node *)0x0);
    }
  }
  ddrel->data = (uint8_t *)pnVar4;
  ddrel->filesize = (unsigned_long)pnVar8;
  ddrel->size = (unsigned_long)pnVar8;
  pnVar7 = (ddrel->sections).first;
  if (pnVar7 != (node *)0x0) {
    pnVar7[4].pred = pnVar4;
    pnVar7[5].next = pnVar8;
  }
  return;
}

Assistant:

static void make_ddrelocs(struct GlobalVars *gv,struct LinkedSection *ddrel)
{
  struct LinkedSection *sdata;
  struct Section *sec;
  struct Reloc *rel;
  uint8_t *table;
  uint32_t *p;
  unsigned long size;
  uint32_t nrelocs = 0;

  if (sdata = find_lnksec(gv,sdata_name,0,0,0,0)) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        nrelocs++;
    }
  }

  size = (nrelocs+1) * sizeof(uint32_t);
  table = alloc(size);
  p = (uint32_t *)table;
  write32be(p++,nrelocs);

  if (sdata) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        write32be(p++,(uint32_t)rel->offset);
    }
  }

  ddrel->data = table;
  ddrel->size = ddrel->filesize = size;
  if (sec = (struct Section *)ddrel->sections.first) {
    sec->data = table;
    sec->size = size;
  }
}